

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManRefinePrintPPis(Ga2_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  bool bVar4;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVec;
  Ga2_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  local_24 = 0;
  do {
    iVar2 = Vec_IntSize(p->vValues);
    bVar4 = false;
    if (local_24 < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vValues,local_24);
      pGStack_20 = Gia_ManObj(pGVar1,iVar2);
      bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) {
      uVar3 = Vec_IntSize(p_00);
      printf("        Current PPIs (%d): ",(ulong)uVar3);
      Vec_IntSort(p_00,1);
      local_24 = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p_00);
        bVar4 = false;
        if (local_24 < iVar2) {
          pGVar1 = p->pGia;
          iVar2 = Vec_IntEntry(p_00,local_24);
          pGStack_20 = Gia_ManObj(pGVar1,iVar2);
          bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        uVar3 = Gia_ObjId(p->pGia,pGStack_20);
        printf("%d ",(ulong)uVar3);
        local_24 = local_24 + 1;
      }
      printf("\n");
      Vec_IntFree(p_00);
      return;
    }
    if ((local_24 != 0) && (iVar2 = Ga2_ObjIsAbs(p,pGStack_20), iVar2 == 0)) {
      if (-1 < *(long *)pGStack_20) {
        __assert_fail("pObj->fPhase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x4d1,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
      }
      iVar2 = Ga2_ObjIsLeaf(p,pGStack_20);
      if (iVar2 == 0) {
        __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x4d2,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
      }
      iVar2 = Gia_ObjIsAnd(pGStack_20);
      if ((iVar2 == 0) && (iVar2 = Gia_ObjIsCi(pGStack_20), iVar2 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x4d3,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
      }
      iVar2 = Gia_ObjId(p->pGia,pGStack_20);
      Vec_IntPush(p_00,iVar2);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Ga2_ManRefinePrintPPis( Ga2_Man_t * p )
{
    Vec_Int_t * vVec = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
    }
    printf( "        Current PPIs (%d): ", Vec_IntSize(vVec) );
    Vec_IntSort( vVec, 1 );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        printf( "%d ", Gia_ObjId(p->pGia, pObj) );
    printf( "\n" );
    Vec_IntFree( vVec );
}